

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libmeshb7.c
# Opt level: O3

int GmfGetFloatPrecision(int64_t MshIdx)

{
  undefined8 in_RAX;
  int64_t iVar1;
  GmfMshSct *msh;
  int FltSiz;
  int local_14;
  
  local_14 = (int)((ulong)in_RAX >> 0x20);
  iVar1 = GmfStatKwd(MshIdx,0x9b);
  if (iVar1 != 0) {
    if (*(long *)(MshIdx + 0x1ef1d8) != 0) {
      fseek(*(FILE **)(MshIdx + 0x300410),*(long *)(MshIdx + 0x1ef1e0),0);
    }
    GmfGetLin(MshIdx,0x9b,&local_14);
    if ((local_14 == 0x40) || (local_14 == 0x20)) {
      *(int *)(MshIdx + 0x18) = local_14;
    }
  }
  return *(int *)(MshIdx + 0x18);
}

Assistant:

int GmfGetFloatPrecision(int64_t MshIdx)
{
   int FltSiz;
   GmfMshSct *msh = (GmfMshSct *)MshIdx;

   if(GmfStatKwd(MshIdx, GmfFloatingPointPrecision))
   {
      GmfGotoKwd(MshIdx, GmfFloatingPointPrecision);
      GmfGetLin(MshIdx, GmfFloatingPointPrecision, &FltSiz);

      if(FltSiz == 32 || FltSiz == 64)
         msh->FltSiz = FltSiz;
   }

   return(msh->FltSiz);
}